

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm_info.cc
# Opt level: O0

void anon_unknown.dwarf_4821::ParseSuperframeIndex
               (uint8_t *data,size_t data_sz,uint32_t *sizes,int *count)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int local_54;
  uint local_50;
  int j;
  uint32_t this_sz;
  int i;
  uint8_t *x;
  size_t index_sz;
  int mag;
  int frames;
  uint8_t marker;
  int *count_local;
  uint32_t *sizes_local;
  size_t data_sz_local;
  uint8_t *data_local;
  
  bVar1 = data[data_sz - 1];
  *count = 0;
  if ((bVar1 & 0xe0) == 0xc0) {
    iVar2 = (bVar1 & 7) + 1;
    iVar3 = ((int)(uint)bVar1 >> 3 & 3U) + 1;
    uVar4 = (ulong)(iVar3 * iVar2 + 2);
    if ((uVar4 <= data_sz) && (data[data_sz - uVar4] == bVar1)) {
      _this_sz = data + (data_sz - uVar4) + 1;
      for (j = 0; j < iVar2; j = j + 1) {
        local_50 = 0;
        for (local_54 = 0; local_54 < iVar3; local_54 = local_54 + 1) {
          local_50 = (uint)*_this_sz << ((byte)(local_54 << 3) & 0x1f) | local_50;
          _this_sz = _this_sz + 1;
        }
        sizes[j] = local_50;
      }
      *count = iVar2;
    }
  }
  return;
}

Assistant:

void ParseSuperframeIndex(const uint8_t* data, size_t data_sz,
                          uint32_t sizes[8], int* count) {
  const uint8_t marker = data[data_sz - 1];
  *count = 0;

  if ((marker & 0xe0) == 0xc0) {
    const int frames = (marker & 0x7) + 1;
    const int mag = ((marker >> 3) & 0x3) + 1;
    const size_t index_sz = 2 + mag * frames;

    if (data_sz >= index_sz && data[data_sz - index_sz] == marker) {
      // found a valid superframe index
      const uint8_t* x = data + data_sz - index_sz + 1;

      for (int i = 0; i < frames; ++i) {
        uint32_t this_sz = 0;

        for (int j = 0; j < mag; ++j) {
          this_sz |= (*x++) << (j * 8);
        }
        sizes[i] = this_sz;
      }
      *count = frames;
    }
  }
}